

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_write_container(cram_fd *fd,cram_container *c)

{
  ushort uVar1;
  hFILE *fp;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  byte bVar7;
  uint *__src;
  ulong uVar6;
  byte bVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  ulong totalbytes;
  ulong uVar13;
  char buf_a [1024];
  uint local_428 [256];
  
  __src = local_428;
  if (0xc1 < c->num_landmarks) {
    __src = (uint *)malloc((ulong)(uint)c->num_landmarks * 5 + 0x37);
  }
  uVar4 = c->length;
  if ((fd->version & 0xffffff00U) == 0x100) {
    bVar2 = (byte)uVar4;
    if (uVar4 < 0x80) {
      *(byte *)__src = bVar2;
      lVar11 = 1;
    }
    else {
      bVar7 = (byte)(uVar4 >> 8);
      if (uVar4 < 0x4000) {
        *(byte *)__src = bVar7 | 0x80;
        *(byte *)((long)__src + 1) = bVar2;
        lVar11 = 2;
      }
      else {
        bVar8 = (byte)(uVar4 >> 0x10);
        if (uVar4 < 0x200000) {
          *(byte *)__src = bVar8 | 0xc0;
          *(byte *)((long)__src + 1) = bVar7;
          *(byte *)((long)__src + 2) = bVar2;
          lVar11 = 3;
        }
        else {
          bVar9 = (byte)(uVar4 >> 0x18);
          if (uVar4 < 0x10000000) {
            *(byte *)__src = bVar9 | 0xe0;
            *(byte *)((long)__src + 1) = bVar8;
            *(byte *)((long)__src + 2) = bVar7;
            *(byte *)((long)__src + 3) = bVar2;
            goto LAB_00130def;
          }
          *(byte *)__src = bVar9 >> 4 | 0xf0;
          *(char *)((long)__src + 1) = (char)(uVar4 >> 0x14);
          *(char *)((long)__src + 2) = (char)(uVar4 >> 0xc);
          *(char *)((long)__src + 3) = (char)(uVar4 >> 4);
          *(byte *)(__src + 1) = bVar2 & 0xf;
          lVar11 = 5;
        }
      }
    }
  }
  else {
    *__src = uVar4;
LAB_00130def:
    lVar11 = 4;
  }
  pbVar12 = (byte *)(lVar11 + (long)__src);
  if (c->multi_seq == 0) {
    uVar4 = c->ref_seq_id;
    if (uVar4 < 0x80) {
      *pbVar12 = (byte)uVar4;
      lVar11 = 1;
    }
    else {
      bVar2 = (byte)(uVar4 >> 8);
      if (uVar4 < 0x4000) {
        *pbVar12 = bVar2 | 0x80;
        pbVar12[1] = (byte)uVar4;
        lVar11 = 2;
      }
      else {
        bVar7 = (byte)(uVar4 >> 0x10);
        if (uVar4 < 0x200000) {
          *pbVar12 = bVar7 | 0xc0;
          pbVar12[1] = bVar2;
          pbVar12[2] = (byte)c->ref_seq_id;
          lVar11 = 3;
        }
        else {
          bVar2 = (byte)(uVar4 >> 0x18);
          if (uVar4 < 0x10000000) {
            *pbVar12 = bVar2 | 0xe0;
            pbVar12[1] = bVar7;
            uVar1 = (ushort)c->ref_seq_id;
            *(ushort *)(pbVar12 + 2) = uVar1 << 8 | uVar1 >> 8;
            lVar11 = 4;
          }
          else {
            *pbVar12 = bVar2 >> 4 | 0xf0;
            pbVar12[1] = (byte)(uVar4 >> 0x14);
            uVar4 = c->ref_seq_id;
            pbVar12[2] = (byte)(uVar4 >> 0xc);
            pbVar12[3] = (byte)(uVar4 >> 4);
            pbVar12[4] = (byte)c->ref_seq_id & 0xf;
            lVar11 = 5;
          }
        }
      }
    }
    pbVar12 = pbVar12 + lVar11;
    uVar4 = c->ref_seq_start;
    if (uVar4 < 0x80) {
      *pbVar12 = (byte)uVar4;
      lVar11 = 1;
    }
    else if (uVar4 < 0x4000) {
      *pbVar12 = (byte)(uVar4 >> 8) | 0x80;
      pbVar12[1] = (byte)c->ref_seq_start;
      lVar11 = 2;
    }
    else if (uVar4 < 0x200000) {
      *pbVar12 = (byte)(uVar4 >> 0x10) | 0xc0;
      uVar1 = (ushort)c->ref_seq_start;
      *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
      lVar11 = 3;
    }
    else {
      bVar2 = (byte)(uVar4 >> 0x18);
      if (uVar4 < 0x10000000) {
        *pbVar12 = bVar2 | 0xe0;
        uVar1 = *(ushort *)((long)&c->ref_seq_start + 1);
        *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
        pbVar12[3] = (byte)c->ref_seq_start;
        lVar11 = 4;
      }
      else {
        *pbVar12 = bVar2 >> 4 | 0xf0;
        uVar4 = c->ref_seq_start;
        pbVar12[1] = (byte)(uVar4 >> 0x14);
        pbVar12[2] = (byte)(uVar4 >> 0xc);
        uVar4 = c->ref_seq_start;
        pbVar12[3] = (byte)(uVar4 >> 4);
        pbVar12[4] = (byte)uVar4 & 0xf;
        lVar11 = 5;
      }
    }
    pbVar12 = pbVar12 + lVar11;
    uVar4 = c->ref_seq_span;
    if (uVar4 < 0x80) {
      *pbVar12 = (byte)uVar4;
      lVar11 = 1;
    }
    else if (uVar4 < 0x4000) {
      *pbVar12 = (byte)(uVar4 >> 8) | 0x80;
      pbVar12[1] = (byte)c->ref_seq_span;
      lVar11 = 2;
    }
    else if (uVar4 < 0x200000) {
      *pbVar12 = (byte)(uVar4 >> 0x10) | 0xc0;
      uVar1 = (ushort)c->ref_seq_span;
      *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
      lVar11 = 3;
    }
    else {
      bVar2 = (byte)(uVar4 >> 0x18);
      if (uVar4 < 0x10000000) {
        *pbVar12 = bVar2 | 0xe0;
        uVar1 = *(ushort *)((long)&c->ref_seq_span + 1);
        *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
        pbVar12[3] = (byte)c->ref_seq_span;
        lVar11 = 4;
      }
      else {
        *pbVar12 = bVar2 >> 4 | 0xf0;
        uVar4 = c->ref_seq_span;
        pbVar12[1] = (byte)(uVar4 >> 0x14);
        pbVar12[2] = (byte)(uVar4 >> 0xc);
        uVar4 = c->ref_seq_span;
        pbVar12[3] = (byte)(uVar4 >> 4);
        pbVar12[4] = (byte)uVar4 & 0xf;
        lVar11 = 5;
      }
    }
    pbVar12 = pbVar12 + lVar11;
  }
  else {
    pbVar12[0] = 0xff;
    pbVar12[1] = 0xff;
    pbVar12[2] = 0xff;
    pbVar12[3] = 0xff;
    pbVar12[4] = 0xe;
    pbVar12[5] = 0;
    pbVar12[6] = 0;
    pbVar12 = pbVar12 + 7;
  }
  uVar4 = c->num_records;
  if (uVar4 < 0x80) {
    *pbVar12 = (byte)uVar4;
    lVar11 = 1;
  }
  else if (uVar4 < 0x4000) {
    *pbVar12 = (byte)(uVar4 >> 8) | 0x80;
    pbVar12[1] = (byte)c->num_records;
    lVar11 = 2;
  }
  else if (uVar4 < 0x200000) {
    *pbVar12 = (byte)(uVar4 >> 0x10) | 0xc0;
    pbVar12[1] = *(byte *)((long)&c->num_records + 1);
    pbVar12[2] = (byte)c->num_records;
    lVar11 = 3;
  }
  else {
    bVar2 = (byte)(uVar4 >> 0x18);
    if (uVar4 < 0x10000000) {
      *pbVar12 = bVar2 | 0xe0;
      pbVar12[1] = *(byte *)((long)&c->num_records + 2);
      pbVar12[2] = *(byte *)((long)&c->num_records + 1);
      pbVar12[3] = (byte)c->num_records;
      lVar11 = 4;
    }
    else {
      *pbVar12 = bVar2 >> 4 | 0xf0;
      pbVar12[1] = (byte)((uint)c->num_records >> 0x14);
      pbVar12[2] = (byte)((uint)c->num_records >> 0xc);
      pbVar12[3] = (byte)((uint)c->num_records >> 4);
      pbVar12[4] = (byte)c->num_records & 0xf;
      lVar11 = 5;
    }
  }
  pbVar12 = pbVar12 + lVar11;
  iVar3 = fd->version >> 8;
  if (iVar3 == 2) {
    uVar6 = c->record_counter;
    if (uVar6 < 0x80) {
      *pbVar12 = (byte)uVar6;
      uVar6 = 1;
    }
    else if (uVar6 < 0x4000) {
      *pbVar12 = (byte)(uVar6 >> 8) | 0x80;
      pbVar12[1] = (byte)c->record_counter;
      uVar6 = 2;
    }
    else if (uVar6 < 0x200000) {
      *pbVar12 = (byte)(uVar6 >> 0x10) | 0xc0;
      pbVar12[1] = *(byte *)((long)&c->record_counter + 1);
      pbVar12[2] = (byte)c->record_counter;
      uVar6 = 3;
    }
    else {
      bVar2 = (byte)(uVar6 >> 0x18);
      if (uVar6 < 0x10000000) {
        *pbVar12 = bVar2 | 0xe0;
        pbVar12[1] = *(byte *)((long)&c->record_counter + 2);
        pbVar12[2] = *(byte *)((long)&c->record_counter + 1);
        pbVar12[3] = (byte)c->record_counter;
        uVar6 = 4;
      }
      else {
        *pbVar12 = bVar2 >> 4 | 0xf0;
        pbVar12[1] = (byte)((uint)c->record_counter >> 0x14);
        pbVar12[2] = (byte)((uint)c->record_counter >> 0xc);
        pbVar12[3] = (byte)((uint)c->record_counter >> 4);
        pbVar12[4] = (byte)c->record_counter & 0xf;
        uVar6 = 5;
      }
    }
  }
  else {
    if (iVar3 < 3) goto LAB_00131273;
    uVar4 = ltf8_put((char *)pbVar12,c->record_counter);
    uVar6 = (ulong)uVar4;
  }
  uVar4 = ltf8_put((char *)(pbVar12 + uVar6),c->num_bases);
  pbVar12 = pbVar12 + uVar6 + uVar4;
LAB_00131273:
  uVar4 = c->num_blocks;
  if (uVar4 < 0x80) {
    *pbVar12 = (byte)uVar4;
    lVar11 = 1;
  }
  else if (uVar4 < 0x4000) {
    *pbVar12 = (byte)(uVar4 >> 8) | 0x80;
    pbVar12[1] = (byte)c->num_blocks;
    lVar11 = 2;
  }
  else if (uVar4 < 0x200000) {
    *pbVar12 = (byte)(uVar4 >> 0x10) | 0xc0;
    pbVar12[1] = *(byte *)((long)&c->num_blocks + 1);
    pbVar12[2] = (byte)c->num_blocks;
    lVar11 = 3;
  }
  else {
    bVar2 = (byte)(uVar4 >> 0x18);
    if (uVar4 < 0x10000000) {
      *pbVar12 = bVar2 | 0xe0;
      pbVar12[1] = *(byte *)((long)&c->num_blocks + 2);
      pbVar12[2] = *(byte *)((long)&c->num_blocks + 1);
      pbVar12[3] = (byte)c->num_blocks;
      lVar11 = 4;
    }
    else {
      *pbVar12 = bVar2 >> 4 | 0xf0;
      pbVar12[1] = (byte)((uint)c->num_blocks >> 0x14);
      pbVar12[2] = (byte)((uint)c->num_blocks >> 0xc);
      pbVar12[3] = (byte)((uint)c->num_blocks >> 4);
      pbVar12[4] = (byte)c->num_blocks & 0xf;
      lVar11 = 5;
    }
  }
  pbVar12 = pbVar12 + lVar11;
  uVar4 = c->num_landmarks;
  if (uVar4 < 0x80) {
    *pbVar12 = (byte)uVar4;
    lVar11 = 1;
  }
  else if (uVar4 < 0x4000) {
    *pbVar12 = (byte)(uVar4 >> 8) | 0x80;
    pbVar12[1] = (byte)c->num_landmarks;
    lVar11 = 2;
  }
  else if (uVar4 < 0x200000) {
    *pbVar12 = (byte)(uVar4 >> 0x10) | 0xc0;
    pbVar12[1] = *(byte *)((long)&c->num_landmarks + 1);
    pbVar12[2] = (byte)c->num_landmarks;
    lVar11 = 3;
  }
  else {
    bVar2 = (byte)(uVar4 >> 0x18);
    if (uVar4 < 0x10000000) {
      *pbVar12 = bVar2 | 0xe0;
      pbVar12[1] = *(byte *)((long)&c->num_landmarks + 2);
      pbVar12[2] = *(byte *)((long)&c->num_landmarks + 1);
      pbVar12[3] = (byte)c->num_landmarks;
      lVar11 = 4;
    }
    else {
      *pbVar12 = bVar2 >> 4 | 0xf0;
      pbVar12[1] = (byte)((uint)c->num_landmarks >> 0x14);
      pbVar12[2] = (byte)((uint)c->num_landmarks >> 0xc);
      pbVar12[3] = (byte)((uint)c->num_landmarks >> 4);
      pbVar12[4] = (byte)c->num_landmarks & 0xf;
      lVar11 = 5;
    }
  }
  pbVar12 = pbVar12 + lVar11;
  if (0 < c->num_landmarks) {
    lVar11 = 0;
    do {
      uVar4 = c->landmark[lVar11];
      if (uVar4 < 0x80) {
        *pbVar12 = (byte)uVar4;
        lVar10 = 1;
      }
      else if (uVar4 < 0x4000) {
        *pbVar12 = (byte)(uVar4 >> 8) | 0x80;
        pbVar12[1] = *(byte *)(c->landmark + lVar11);
        lVar10 = 2;
      }
      else if (uVar4 < 0x200000) {
        *pbVar12 = (byte)(uVar4 >> 0x10) | 0xc0;
        pbVar12[1] = *(byte *)((long)c->landmark + lVar11 * 4 + 1);
        pbVar12[2] = *(byte *)(c->landmark + lVar11);
        lVar10 = 3;
      }
      else {
        bVar2 = (byte)(uVar4 >> 0x18);
        if (uVar4 < 0x10000000) {
          *pbVar12 = bVar2 | 0xe0;
          pbVar12[1] = *(byte *)((long)c->landmark + lVar11 * 4 + 2);
          pbVar12[2] = *(byte *)((long)c->landmark + lVar11 * 4 + 1);
          pbVar12[3] = *(byte *)(c->landmark + lVar11);
          lVar10 = 4;
        }
        else {
          *pbVar12 = bVar2 >> 4 | 0xf0;
          pbVar12[1] = (byte)((uint)c->landmark[lVar11] >> 0x14);
          pbVar12[2] = (byte)((uint)c->landmark[lVar11] >> 0xc);
          pbVar12[3] = (byte)((uint)c->landmark[lVar11] >> 4);
          pbVar12[4] = *(byte *)(c->landmark + lVar11) & 0xf;
          lVar10 = 5;
        }
      }
      pbVar12 = pbVar12 + lVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 < c->num_landmarks);
  }
  if (0x2ff < fd->version) {
    uVar5 = crc32(0,__src,(int)pbVar12 - (int)__src);
    c->crc32 = uVar5;
    *pbVar12 = (byte)uVar5;
    pbVar12[1] = *(byte *)((long)&c->crc32 + 1);
    pbVar12[2] = *(byte *)((long)&c->crc32 + 2);
    pbVar12[3] = *(byte *)((long)&c->crc32 + 3);
    pbVar12 = pbVar12 + 4;
  }
  totalbytes = (long)pbVar12 - (long)__src;
  fp = fd->fp;
  uVar13 = (long)fp->limit - (long)fp->begin;
  uVar6 = totalbytes;
  if (uVar13 < totalbytes) {
    uVar6 = uVar13;
  }
  memcpy(fp->begin,__src,uVar6);
  fp->begin = fp->begin + uVar6;
  if (uVar13 < totalbytes) {
    uVar6 = hwrite2(fp,__src,totalbytes,uVar6);
  }
  if (__src != local_428) {
    free(__src);
  }
  return -(uint)(totalbytes != uVar6);
}

Assistant:

int cram_write_container(cram_fd *fd, cram_container *c) {
    char buf_a[1024], *buf = buf_a, *cp;
    int i;

    if (55 + c->num_landmarks * 5 >= 1024)
	buf = malloc(55 + c->num_landmarks * 5);
    cp = buf;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_put(cp, c->length);
    } else {
	*(int32_t *)cp = le_int4(c->length);
	cp += 4;
    }
    if (c->multi_seq) {
	cp += itf8_put(cp, -2);
	cp += itf8_put(cp, 0);
	cp += itf8_put(cp, 0);
    } else {
	cp += itf8_put(cp, c->ref_seq_id);
	cp += itf8_put(cp, c->ref_seq_start);
	cp += itf8_put(cp, c->ref_seq_span);
    }
    cp += itf8_put(cp, c->num_records);
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	cp += itf8_put(cp, c->record_counter);
	cp += ltf8_put(cp, c->num_bases);
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_put(cp, c->record_counter);
	cp += ltf8_put(cp, c->num_bases);
    }

    cp += itf8_put(cp, c->num_blocks);
    cp += itf8_put(cp, c->num_landmarks);
    for (i = 0; i < c->num_landmarks; i++)
	cp += itf8_put(cp, c->landmark[i]);

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	c->crc32 = crc32(0L, (uc *)buf, cp-buf);
	cp[0] =  c->crc32        & 0xff;
	cp[1] = (c->crc32 >>  8) & 0xff;
	cp[2] = (c->crc32 >> 16) & 0xff;
	cp[3] = (c->crc32 >> 24) & 0xff;
	cp += 4;
    }

    if (cp-buf != hwrite(fd->fp, buf, cp-buf)) {
	if (buf != buf_a)
	    free(buf);
	return -1;
    }

    if (buf != buf_a)
	free(buf);

    return 0;
}